

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

size_t wasm::file_size(string *filename)

{
  _Ios_Openmode _Var1;
  size_t sVar2;
  fpos local_258 [32];
  PathString local_238;
  undefined1 local_218 [8];
  ifstream infile;
  string *filename_local;
  
  Path::to_path(&local_238,filename);
  _Var1 = std::operator|(_S_ate,_S_bin);
  std::ifstream::ifstream(local_218,(string *)&local_238,_Var1);
  std::__cxx11::string::~string((string *)&local_238);
  local_258._0_16_ = std::istream::tellg();
  sVar2 = std::fpos::operator_cast_to_long(local_258);
  std::ifstream::~ifstream(local_218);
  return sVar2;
}

Assistant:

size_t wasm::file_size(std::string filename) {
  std::ifstream infile(wasm::Path::to_path(filename),
                       std::ifstream::ate | std::ifstream::binary);
  return infile.tellg();
}